

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

int ps_config_free(ps_config_t *config)

{
  int iVar1;
  int iVar2;
  glist_t g;
  int32 i;
  long lVar3;
  gnode_s *pgVar4;
  int32 n;
  int32 local_1c;
  
  iVar2 = 0;
  if (config != (ps_config_t *)0x0) {
    iVar1 = config->refcount;
    iVar2 = iVar1 + -1;
    config->refcount = iVar2;
    if (iVar1 < 2) {
      if (config->ht != (hash_table_t *)0x0) {
        g = hash_table_tolist(config->ht,&local_1c);
        for (pgVar4 = g; pgVar4 != (glist_t)0x0; pgVar4 = pgVar4->next) {
          cmd_ln_val_free(*(cmd_ln_val_t **)((pgVar4->data).i + 0x10));
        }
        glist_free(g);
        hash_table_free(config->ht);
        config->ht = (hash_table_t *)0x0;
      }
      if (config->f_argv != (char **)0x0) {
        for (lVar3 = 0; lVar3 < (int)config->f_argc; lVar3 = lVar3 + 1) {
          ckd_free(config->f_argv[lVar3]);
        }
        ckd_free(config->f_argv);
        config->f_argv = (char **)0x0;
        config->f_argc = 0;
      }
      if (config->json != (char *)0x0) {
        ckd_free(config->json);
      }
      ckd_free(config);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
ps_config_free(ps_config_t *config)
{
    if (config == NULL)
        return 0;
    if (--config->refcount > 0)
        return config->refcount;
    if (config->ht) {
        glist_t entries;
        gnode_t *gn;
        int32 n;

        entries = hash_table_tolist(config->ht, &n);
        for (gn = entries; gn; gn = gnode_next(gn)) {
            hash_entry_t *e = (hash_entry_t *)gnode_ptr(gn);
            cmd_ln_val_free((cmd_ln_val_t *)e->val);
        }
        glist_free(entries);
        hash_table_free(config->ht);
        config->ht = NULL;
    }

    if (config->f_argv) {
        int32 i;
        for (i = 0; i < (int32)config->f_argc; ++i) {
            ckd_free(config->f_argv[i]);
        }
        ckd_free(config->f_argv);
        config->f_argv = NULL;
        config->f_argc = 0;
    }
    if (config->json)
        ckd_free(config->json);
    ckd_free(config);
    return 0;
}